

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int x86MOVSXD(uchar *stream,x86Reg dst,x86Size size,x86Reg index,int multiplier,x86Reg base,
             int shift)

{
  uchar *puVar1;
  uint uVar2;
  
  uVar2 = encodeRex(stream,true,dst,index,base);
  puVar1 = stream + uVar2;
  *puVar1 = 'c';
  uVar2 = encodeAddress(puVar1 + 1,index,multiplier,base,shift,(int)regCode[dst]);
  return (uVar2 + (int)(puVar1 + 1)) - (int)stream;
}

Assistant:

int x86MOVSXD(unsigned char *stream, x86Reg dst, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	(void)size;

	unsigned char *start = stream;

	stream += encodeRex(stream, true, dst, index, base);
	*stream++ = 0x63;
	stream += encodeAddress(stream, index, multiplier, base, shift, regCode[dst]);

	return int(stream - start);
}